

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceOfRevolution::IfcSurfaceOfRevolution
          (IfcSurfaceOfRevolution *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcSurfaceOfRevolution";
  IfcSweptSurface::IfcSweptSurface
            (&this->super_IfcSweptSurface,&PTR_construction_vtable_24__0082eeb8);
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x60 = 0;
  (this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x82edd8;
  *(undefined8 *)&this->field_0x68 = 0x82eea0;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x82ee00;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x82ee28;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       0x82ee50;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x50 = 0x82ee78;
  return;
}

Assistant:

IfcSurfaceOfRevolution() : Object("IfcSurfaceOfRevolution") {}